

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

int __thiscall ONX_Model::AddDefaultLayer(ONX_Model *this,wchar_t *layer_name,ON_Color layer_color)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_Layer *pOVar6;
  wchar_t *component_name;
  ON_UUID *pOVar7;
  ON_UUID layer_model_id;
  uint in_stack_fffffffffffffd4c;
  ON_Layer *managed_layer_1;
  ON_ModelComponentReference mr_1;
  int layer_index;
  ON_Layer *managed_layer;
  ON_ModelComponentReference mr;
  ON_ComponentManifest local_178;
  undefined1 local_170 [8];
  ON_Layer default_layer;
  int local_70;
  ON_Layer *layer;
  undefined1 local_48 [8];
  ON_ModelComponentReference mcr;
  int pass;
  int default_layer_index;
  ON_UUID default_layer_id;
  wchar_t *layer_name_local;
  ONX_Model *this_local;
  ON_Color layer_color_local;
  
  default_layer_id.Data4 = (uchar  [8])layer_name;
  this_local._0_4_ = layer_color.field_0;
  _pass = ON_3dmSettings::CurrentLayerId(&this->m_settings);
  mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = ON_3dmSettings::CurrentLayerIndex(&this->m_settings);
  mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = 0;
  do {
    if (1 < (int)mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi) {
      mr_1.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = this_local._0_4_;
      mr_1.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = AddLayer(this,(wchar_t *)default_layer_id.Data4,(ON_Color)this_local._0_4_);
      if (-1 < mr_1.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_) {
        LayerFromIndex((ONX_Model *)&managed_layer_1,(int)this);
        pOVar6 = ON_Layer::FromModelComponentRef
                           ((ON_ModelComponentReference *)&managed_layer_1,(ON_Layer *)0x0);
        if (((pOVar6 == (ON_Layer *)0x0) ||
            (iVar3 = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent), iVar3 < 0)) ||
           (bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar6->super_ON_ModelComponent), bVar1))
        {
          bVar1 = false;
        }
        else {
          pOVar7 = ON_ModelComponent::Id(&pOVar6->super_ON_ModelComponent);
          ON_3dmSettings::SetCurrentLayerId(&this->m_settings,*pOVar7);
          this_local._4_4_ = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent);
          bVar1 = true;
        }
        ON_ModelComponentReference::~ON_ModelComponentReference
                  ((ON_ModelComponentReference *)&managed_layer_1);
        if (bVar1) {
          return this_local._4_4_;
        }
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                 ,0x4f2,"","Failed to add default layer.");
      return -0x7fffffff;
    }
    if ((int)mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 0) {
      bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&pass);
      if (!bVar1) {
LAB_005f7001:
        if ((int)mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi == 0) {
          layer_model_id.Data4 = (uchar  [8])_pass;
          layer_model_id._0_8_ = this;
          LayerFromId((ONX_Model *)local_48,layer_model_id);
        }
        else {
          LayerFromIndex((ONX_Model *)local_48,(int)this);
        }
        pOVar6 = ON_Layer::FromModelComponentRef
                           ((ON_ModelComponentReference *)local_48,(ON_Layer *)0x0);
        if (pOVar6 == (ON_Layer *)0x0) {
          local_70 = 4;
        }
        else {
          bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar6->super_ON_ModelComponent);
          if ((((bVar1) ||
               (iVar3 = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent), iVar3 < 0)) ||
              (bVar1 = ON_ModelComponent::ParentIdIsNil(&pOVar6->super_ON_ModelComponent), !bVar1))
             || ((bVar1 = ON_Layer::IsVisible(pOVar6), !bVar1 ||
                 (bVar1 = ON_ModelComponent::IsLocked(&pOVar6->super_ON_ModelComponent), bVar1)))) {
            ON_Layer::ON_Layer((ON_Layer *)local_170,pOVar6);
            ON_ModelComponent::ClearId((ON_ModelComponent *)local_170);
            ON_ModelComponent::ClearIndex((ON_ModelComponent *)local_170);
            ON_ModelComponent::ClearParentId((ON_ModelComponent *)local_170);
            ON_Layer::SetVisible((ON_Layer *)local_170,true);
            ON_Layer::SetLocked((ON_Layer *)local_170,false);
            if ((default_layer_id.Data4 == (uchar  [8])0x0) || (*(int *)default_layer_id.Data4 == 0)
               ) {
              default_layer_id.Data4 =
                   (uchar  [8])ON_ModelComponent::NameAsPointer(&pOVar6->super_ON_ModelComponent);
            }
            TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)local_170);
            ON_ComponentManifest::UnusedName
                      (&local_178,(char)this - 0x30,(ON_UUID)ZEXT116(TVar2),
                       (wchar_t *)(uchar  [8])0x0,(wchar_t *)default_layer_id.Data4,(wchar_t *)0x0,0
                       ,(uint *)((ulong)in_stack_fffffffffffffd4c << 0x20));
            component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_178);
            ON_ModelComponent::SetName((ON_ModelComponent *)local_170,component_name);
            ON_wString::~ON_wString((ON_wString *)&local_178);
            uVar4 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
            uVar5 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&this_local);
            if (uVar4 != uVar5) {
              mr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ = this_local._0_4_;
              ON_Layer::SetColor((ON_Layer *)local_170,(ON_Color)this_local._0_4_);
            }
            AddModelComponent((ONX_Model *)&managed_layer,(ON_ModelComponent *)this,
                              SUB81(local_170,0));
            pOVar6 = ON_Layer::FromModelComponentRef
                               ((ON_ModelComponentReference *)&managed_layer,(ON_Layer *)0x0);
            if (((pOVar6 == (ON_Layer *)0x0) ||
                (iVar3 = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent), iVar3 < 0)) ||
               (bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar6->super_ON_ModelComponent),
               bVar1)) {
              local_70 = 0;
            }
            else {
              pOVar7 = ON_ModelComponent::Id(&pOVar6->super_ON_ModelComponent);
              ON_3dmSettings::SetCurrentLayerId(&this->m_settings,*pOVar7);
              this_local._4_4_ = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent);
              local_70 = 1;
            }
            ON_ModelComponentReference::~ON_ModelComponentReference
                      ((ON_ModelComponentReference *)&managed_layer);
            ON_Layer::~ON_Layer((ON_Layer *)local_170);
          }
          else {
            pOVar7 = ON_ModelComponent::Id(&pOVar6->super_ON_ModelComponent);
            default_layer.m_private = *(ON_LayerPrivate **)pOVar7;
            ON_3dmSettings::SetCurrentLayerId(&this->m_settings,*pOVar7);
            this_local._4_4_ = ON_ModelComponent::Index(&pOVar6->super_ON_ModelComponent);
            local_70 = 1;
          }
        }
        ON_ModelComponentReference::~ON_ModelComponentReference
                  ((ON_ModelComponentReference *)local_48);
        if ((local_70 != 0) && (local_70 == 1)) {
          return this_local._4_4_;
        }
      }
    }
    else if (mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_ != -0x7fffffff) goto LAB_005f7001;
    mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = (int)mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 1;
  } while( true );
}

Assistant:

int ONX_Model::AddDefaultLayer(
  const wchar_t* layer_name,
  ON_Color layer_color
)
{
  ON_UUID default_layer_id = m_settings.CurrentLayerId();
  int default_layer_index = m_settings.CurrentLayerIndex();
  for ( int pass = 0; pass < 2; pass++ )
  {
    if (0 == pass)
    {
      if (ON_nil_uuid == default_layer_id)
        continue;
    }
    else 
    {
      if (ON_UNSET_INT_INDEX == default_layer_index)
        continue;
    }
    ON_ModelComponentReference mcr
      = (0 == pass)
      ? LayerFromId(default_layer_id)
      : LayerFromIndex(default_layer_index);

    const ON_Layer* layer = ON_Layer::FromModelComponentRef(mcr, nullptr);
    if (nullptr == layer)
      continue;
    if (false == layer->IsSystemComponent() && layer->Index() >= 0 && layer->ParentIdIsNil() && layer->IsVisible() && false == layer->IsLocked() )
    {
      m_settings.SetCurrentLayerId(layer->Id());
      return layer->Index();
    }
    ON_Layer default_layer(*layer);
    default_layer.ClearId();
    default_layer.ClearIndex();
    default_layer.ClearParentId();
    default_layer.SetVisible(true);
    default_layer.SetLocked(false);

    if (nullptr == layer_name || 0 == layer_name[0])
      layer_name = layer->NameAsPointer();
    default_layer.SetName(m_manifest.UnusedName(default_layer.ComponentType(), ON_nil_uuid, layer_name, nullptr, nullptr, 0, nullptr) );

    if (ON_Color::UnsetColor != layer_color)
      default_layer.SetColor(layer_color);

    const ON_ModelComponentReference mr = AddModelComponent(default_layer, true);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  int layer_index = AddLayer(layer_name, layer_color);
  if (layer_index >= 0)
  {
    const ON_ModelComponentReference mr = LayerFromIndex(layer_index);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  ON_ERROR("Failed to add default layer.");
  return ON_UNSET_INT_INDEX;  
}